

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void __thiscall wasm::FunctionValidator::visitSIMDTernary(FunctionValidator *this,SIMDTernary *curr)

{
  bool result;
  Module *pMVar1;
  Type local_58;
  Type local_50;
  Type local_48;
  Type local_40;
  Type local_38;
  Type local_30;
  Type local_28;
  Type local_20;
  SIMDTernary *local_18;
  SIMDTernary *curr_local;
  FunctionValidator *this_local;
  
  local_18 = curr;
  curr_local = (SIMDTernary *)this;
  pMVar1 = Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     );
  result = FeatureSet::hasSIMD(&pMVar1->features);
  shouldBeTrue<wasm::SIMDTernary*>
            (this,result,local_18,"SIMD operations require SIMD [--enable-simd]");
  local_20.id = (local_18->super_SpecificExpression<(wasm::Expression::Id)32>).super_Expression.type
                .id;
  wasm::Type::Type(&local_28,v128);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDTernary*,wasm::Type>
            (this,local_20,local_28,local_18,"SIMD ternary must have type v128");
  local_30.id = (local_18->a->type).id;
  wasm::Type::Type(&local_38,v128);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDTernary*,wasm::Type>
            (this,local_30,local_38,local_18,"expected operand of type v128");
  local_40.id = (local_18->b->type).id;
  wasm::Type::Type(&local_48,v128);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDTernary*,wasm::Type>
            (this,local_40,local_48,local_18,"expected operand of type v128");
  local_50.id = (local_18->c->type).id;
  wasm::Type::Type(&local_58,v128);
  shouldBeEqualOrFirstIsUnreachable<wasm::SIMDTernary*,wasm::Type>
            (this,local_50,local_58,local_18,"expected operand of type v128");
  return;
}

Assistant:

void FunctionValidator::visitSIMDTernary(SIMDTernary* curr) {
  shouldBeTrue(getModule()->features.hasSIMD(),
               curr,
               "SIMD operations require SIMD [--enable-simd]");
  shouldBeEqualOrFirstIsUnreachable(
    curr->type, Type(Type::v128), curr, "SIMD ternary must have type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->a->type, Type(Type::v128), curr, "expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->b->type, Type(Type::v128), curr, "expected operand of type v128");
  shouldBeEqualOrFirstIsUnreachable(
    curr->c->type, Type(Type::v128), curr, "expected operand of type v128");
}